

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O1

int __thiscall
btSequentialImpulseConstraintSolver::getOrInitSolverBody
          (btSequentialImpulseConstraintSolver *this,btCollisionObject *body,btScalar timeStep)

{
  int *piVar1;
  void *__src;
  undefined8 *puVar2;
  undefined8 *puVar3;
  btVector3 *pbVar4;
  btScalar *pbVar5;
  float fVar6;
  int iVar7;
  btSolverBody *pbVar8;
  undefined8 uVar9;
  btMatrix3x3 *pbVar10;
  long lVar11;
  int iVar12;
  btSequentialImpulseConstraintSolver *this_00;
  long lVar13;
  int iVar14;
  btSolverBody *local_148;
  btSolverBody *local_140;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [184];
  
  iVar14 = body->m_companionId;
  if (iVar14 < 0) {
    if (((body->m_internalType & 2) == 0) ||
       (((fVar6 = body[1].m_interpolationWorldTransform.m_basis.m_el[0].m_floats[1], fVar6 == 0.0 &&
         (!NAN(fVar6))) && ((body->m_collisionFlags & 2) == 0)))) {
      if (this->m_fixedBodyId < 0) {
        iVar14 = (this->m_tmpSolverBodyPool).m_size;
        this->m_fixedBodyId = iVar14;
        memset(local_128,0,0xf8);
        iVar7 = (this->m_tmpSolverBodyPool).m_capacity;
        if (iVar14 == iVar7) {
          iVar12 = 1;
          if (iVar14 != 0) {
            iVar12 = iVar14 * 2;
          }
          if (iVar7 < iVar12) {
            if (iVar12 == 0) {
              local_148 = (btSolverBody *)0x0;
            }
            else {
              local_148 = (btSolverBody *)btAlignedAllocInternal((long)iVar12 * 0xf8,0x10);
            }
            lVar11 = (long)(this->m_tmpSolverBodyPool).m_size;
            if (0 < lVar11) {
              lVar13 = 0;
              do {
                puVar2 = (undefined8 *)
                         ((long)(((this->m_tmpSolverBodyPool).m_data)->m_worldTransform).m_basis.
                                m_el[0].m_floats + lVar13);
                uVar9 = puVar2[1];
                puVar3 = (undefined8 *)
                         ((long)(local_148->m_worldTransform).m_basis.m_el[0].m_floats + lVar13);
                *puVar3 = *puVar2;
                puVar3[1] = uVar9;
                uVar9 = puVar2[3];
                puVar3 = (undefined8 *)
                         ((long)(local_148->m_worldTransform).m_basis.m_el[1].m_floats + lVar13);
                *puVar3 = puVar2[2];
                puVar3[1] = uVar9;
                uVar9 = puVar2[5];
                puVar3 = (undefined8 *)
                         ((long)(local_148->m_worldTransform).m_basis.m_el[2].m_floats + lVar13);
                *puVar3 = puVar2[4];
                puVar3[1] = uVar9;
                uVar9 = puVar2[7];
                puVar3 = (undefined8 *)
                         ((long)(local_148->m_worldTransform).m_origin.m_floats + lVar13);
                *puVar3 = puVar2[6];
                puVar3[1] = uVar9;
                memcpy((void *)((long)(local_148->m_deltaLinearVelocity).m_floats + lVar13),
                       puVar2 + 8,0xb8);
                lVar13 = lVar13 + 0xf8;
              } while (lVar11 * 0xf8 - lVar13 != 0);
            }
            pbVar8 = (this->m_tmpSolverBodyPool).m_data;
            if (pbVar8 != (btSolverBody *)0x0) {
              if ((this->m_tmpSolverBodyPool).m_ownsMemory == true) {
                btAlignedFreeInternal(pbVar8);
              }
              (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
            }
            (this->m_tmpSolverBodyPool).m_ownsMemory = true;
            (this->m_tmpSolverBodyPool).m_data = local_148;
            (this->m_tmpSolverBodyPool).m_capacity = iVar12;
          }
        }
        piVar1 = &(this->m_tmpSolverBodyPool).m_size;
        *piVar1 = *piVar1 + 1;
        pbVar8 = (this->m_tmpSolverBodyPool).m_data + iVar14;
        (pbVar8->m_worldTransform).m_basis.m_el[0].m_floats[0] = 0.0;
        (pbVar8->m_worldTransform).m_basis.m_el[0].m_floats[1] = 0.0;
        pbVar10 = &(pbVar8->m_worldTransform).m_basis;
        pbVar10->m_el[0].m_floats[2] = 0.0;
        pbVar10->m_el[0].m_floats[3] = 0.0;
        *(undefined8 *)(pbVar8->m_worldTransform).m_basis.m_el[1].m_floats = local_118;
        *(undefined8 *)((pbVar8->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uStack_110;
        *(undefined8 *)(pbVar8->m_worldTransform).m_basis.m_el[2].m_floats = local_108;
        *(undefined8 *)((pbVar8->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uStack_100;
        *(undefined8 *)(pbVar8->m_worldTransform).m_origin.m_floats = local_f8;
        *(undefined8 *)((pbVar8->m_worldTransform).m_origin.m_floats + 2) = uStack_f0;
        memcpy(&pbVar8->m_deltaLinearVelocity,local_e8,0xb8);
        pbVar8 = (this->m_tmpSolverBodyPool).m_data;
        pbVar4 = &pbVar8[iVar14].m_deltaAngularVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_deltaLinearVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_pushVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_turnVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar8[iVar14].m_worldTransform.m_basis.m_el[0].m_floats[0] = 1.0;
        pbVar5 = pbVar8[iVar14].m_worldTransform.m_basis.m_el[0].m_floats + 1;
        pbVar5[0] = 0.0;
        pbVar5[1] = 0.0;
        *(undefined8 *)(pbVar5 + 2) = 0;
        pbVar8[iVar14].m_worldTransform.m_basis.m_el[1].m_floats[1] = 1.0;
        pbVar5 = pbVar8[iVar14].m_worldTransform.m_basis.m_el[1].m_floats + 2;
        pbVar5[0] = 0.0;
        pbVar5[1] = 0.0;
        *(undefined8 *)(pbVar5 + 2) = 0;
        pbVar8[iVar14].m_worldTransform.m_basis.m_el[2].m_floats[2] = 1.0;
        pbVar5 = pbVar8[iVar14].m_worldTransform.m_basis.m_el[2].m_floats + 3;
        *(undefined8 *)pbVar5 = 0;
        *(undefined8 *)(pbVar5 + 2) = 0;
        pbVar8[iVar14].m_worldTransform.m_origin.m_floats[3] = 0.0;
        pbVar8[iVar14].m_originalBody = (btRigidBody *)0x0;
        pbVar4 = &pbVar8[iVar14].m_invMass;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_angularFactor;
        pbVar4->m_floats[0] = 1.0;
        pbVar4->m_floats[1] = 1.0;
        pbVar4->m_floats[2] = 1.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_linearFactor;
        pbVar4->m_floats[0] = 1.0;
        pbVar4->m_floats[1] = 1.0;
        pbVar4->m_floats[2] = 1.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_linearVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_angularVelocity;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_externalForceImpulse;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
        pbVar4 = &pbVar8[iVar14].m_externalTorqueImpulse;
        pbVar4->m_floats[0] = 0.0;
        pbVar4->m_floats[1] = 0.0;
        pbVar4->m_floats[2] = 0.0;
        pbVar4->m_floats[3] = 0.0;
      }
      iVar14 = this->m_fixedBodyId;
    }
    else {
      iVar14 = (this->m_tmpSolverBodyPool).m_size;
      memset(local_128,0,0xf8);
      iVar7 = (this->m_tmpSolverBodyPool).m_capacity;
      if (iVar14 == iVar7) {
        iVar12 = 1;
        if (iVar14 != 0) {
          iVar12 = iVar14 * 2;
        }
        if (iVar7 < iVar12) {
          if (iVar12 == 0) {
            local_140 = (btSolverBody *)0x0;
          }
          else {
            local_140 = (btSolverBody *)btAlignedAllocInternal((long)iVar12 * 0xf8,0x10);
          }
          lVar11 = (long)(this->m_tmpSolverBodyPool).m_size;
          if (0 < lVar11) {
            lVar13 = 0;
            do {
              __src = (void *)((long)(((this->m_tmpSolverBodyPool).m_data)->m_deltaLinearVelocity).
                                     m_floats + lVar13);
              uVar9 = *(undefined8 *)((long)__src + -0x38);
              puVar2 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[0].m_floats + lVar13);
              *puVar2 = *(undefined8 *)((long)__src + -0x40);
              puVar2[1] = uVar9;
              uVar9 = *(undefined8 *)((long)__src + -0x28);
              puVar2 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[1].m_floats + lVar13);
              *puVar2 = *(undefined8 *)((long)__src + -0x30);
              puVar2[1] = uVar9;
              uVar9 = *(undefined8 *)((long)__src + -0x18);
              puVar2 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_basis.m_el[2].m_floats + lVar13);
              *puVar2 = *(undefined8 *)((long)__src + -0x20);
              puVar2[1] = uVar9;
              uVar9 = *(undefined8 *)((long)__src + -8);
              puVar2 = (undefined8 *)
                       ((long)(local_140->m_worldTransform).m_origin.m_floats + lVar13);
              *puVar2 = *(undefined8 *)((long)__src + -0x10);
              puVar2[1] = uVar9;
              memcpy((void *)((long)(local_140->m_deltaLinearVelocity).m_floats + lVar13),__src,0xb8
                    );
              lVar13 = lVar13 + 0xf8;
            } while (lVar11 * 0xf8 - lVar13 != 0);
          }
          pbVar8 = (this->m_tmpSolverBodyPool).m_data;
          if (pbVar8 != (btSolverBody *)0x0) {
            if ((this->m_tmpSolverBodyPool).m_ownsMemory == true) {
              btAlignedFreeInternal(pbVar8);
            }
            (this->m_tmpSolverBodyPool).m_data = (btSolverBody *)0x0;
          }
          (this->m_tmpSolverBodyPool).m_ownsMemory = true;
          (this->m_tmpSolverBodyPool).m_data = local_140;
          (this->m_tmpSolverBodyPool).m_capacity = iVar12;
        }
      }
      piVar1 = &(this->m_tmpSolverBodyPool).m_size;
      *piVar1 = *piVar1 + 1;
      pbVar8 = (this->m_tmpSolverBodyPool).m_data + iVar14;
      this_00 = (btSequentialImpulseConstraintSolver *)&pbVar8->m_deltaLinearVelocity;
      (pbVar8->m_worldTransform).m_basis.m_el[0].m_floats[0] = 0.0;
      (pbVar8->m_worldTransform).m_basis.m_el[0].m_floats[1] = 0.0;
      pbVar10 = &(pbVar8->m_worldTransform).m_basis;
      pbVar10->m_el[0].m_floats[2] = 0.0;
      pbVar10->m_el[0].m_floats[3] = 0.0;
      *(undefined8 *)(pbVar8->m_worldTransform).m_basis.m_el[1].m_floats = local_118;
      *(undefined8 *)((pbVar8->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uStack_110;
      *(undefined8 *)(pbVar8->m_worldTransform).m_basis.m_el[2].m_floats = local_108;
      *(undefined8 *)((pbVar8->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uStack_100;
      *(undefined8 *)(pbVar8->m_worldTransform).m_origin.m_floats = local_f8;
      *(undefined8 *)((pbVar8->m_worldTransform).m_origin.m_floats + 2) = uStack_f0;
      memcpy(this_00,local_e8,0xb8);
      initSolverBody(this_00,(this->m_tmpSolverBodyPool).m_data + iVar14,body,timeStep);
      body->m_companionId = iVar14;
    }
  }
  return iVar14;
}

Assistant:

btSingleConstraintRowSolver	btSequentialImpulseConstraintSolver::getSSE2ConstraintRowSolverLowerLimit()
 {
	 return gResolveSingleConstraintRowLowerLimit_sse2;
 }